

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testIsComplete.cpp
# Opt level: O3

void testIsComplete(string *tempDir)

{
  pointer pcVar1;
  _Alloc_hider _Var2;
  _Alloc_hider _Var3;
  _Alloc_hider _Var4;
  _Alloc_hider _Var5;
  char cVar6;
  int iVar7;
  int iVar8;
  void *pvVar9;
  undefined8 uVar10;
  RgbaOutputFile out;
  string ict;
  string ct;
  string icsl;
  string csl;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing isComplete() function",0x1d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  csl._M_dataplus._M_p = (pointer)&csl.field_2;
  pcVar1 = (tempDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&csl,pcVar1,pcVar1 + tempDir->_M_string_length);
  std::__cxx11::string::append((char *)&csl);
  icsl._M_dataplus._M_p = (pointer)&icsl.field_2;
  pcVar1 = (tempDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&icsl,pcVar1,pcVar1 + tempDir->_M_string_length);
  std::__cxx11::string::append((char *)&icsl);
  ct._M_dataplus._M_p = (pointer)&ct.field_2;
  pcVar1 = (tempDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)&ct,pcVar1,pcVar1 + tempDir->_M_string_length)
  ;
  std::__cxx11::string::append((char *)&ct);
  ict._M_dataplus._M_p = (pointer)&ict.field_2;
  pcVar1 = (tempDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&ict,pcVar1,pcVar1 + tempDir->_M_string_length);
  std::__cxx11::string::append((char *)&ict);
  _Var5 = csl._M_dataplus;
  _Var4 = icsl._M_dataplus;
  _Var3 = ct._M_dataplus;
  _Var2 = ict._M_dataplus;
  pvVar9 = operator_new__(0xb8938);
  testIsComplete();
  local_38 = 0;
  uVar10 = Imf_3_2::globalThreadCount();
  Imf_3_2::RgbaOutputFile::RgbaOutputFile
            ((RgbaOutputFile *)0x3f800000,0x3f800000,&out,_Var5._M_p,0x147,0x121,0xf,&local_38,0,4,
             uVar10);
  Imf_3_2::RgbaOutputFile::setFrameBuffer((Rgba *)&out,(ulong)pvVar9,1);
  Imf_3_2::RgbaOutputFile::writePixels((int)&out);
  Imf_3_2::RgbaOutputFile::~RgbaOutputFile(&out);
  local_40 = 0;
  uVar10 = Imf_3_2::globalThreadCount();
  Imf_3_2::RgbaOutputFile::RgbaOutputFile
            ((RgbaOutputFile *)0x3f800000,0x3f800000,&out,_Var4._M_p,0x147,0x121,0xf,&local_40,0,4,
             uVar10);
  Imf_3_2::RgbaOutputFile::setFrameBuffer((Rgba *)&out,(ulong)pvVar9,1);
  Imf_3_2::RgbaOutputFile::writePixels((int)&out);
  Imf_3_2::RgbaOutputFile::~RgbaOutputFile(&out);
  local_48 = 0;
  uVar10 = Imf_3_2::globalThreadCount();
  Imf_3_2::TiledRgbaOutputFile::TiledRgbaOutputFile
            ((TiledRgbaOutputFile *)0x3f800000,0x3f800000,&out,_Var3._M_p,0x147,0x121,0x11,0x11,0,0,
             0xf,&local_48,0,3,uVar10);
  Imf_3_2::TiledRgbaOutputFile::setFrameBuffer((Rgba *)&out,(ulong)pvVar9,1);
  iVar7 = Imf_3_2::TiledRgbaOutputFile::numXTiles((int)&out);
  iVar8 = Imf_3_2::TiledRgbaOutputFile::numYTiles((int)&out);
  Imf_3_2::TiledRgbaOutputFile::writeTiles((int)&out,0,iVar7 + -1,0,iVar8 + -1);
  Imf_3_2::TiledRgbaOutputFile::~TiledRgbaOutputFile((TiledRgbaOutputFile *)&out);
  local_50 = 0;
  uVar10 = Imf_3_2::globalThreadCount();
  Imf_3_2::TiledRgbaOutputFile::TiledRgbaOutputFile
            ((TiledRgbaOutputFile *)0x3f800000,0x3f800000,&out,_Var2._M_p,0x147,0x121,0x11,0x11,0,0,
             0xf,&local_50,0,3,uVar10);
  Imf_3_2::TiledRgbaOutputFile::setFrameBuffer((Rgba *)&out,(ulong)pvVar9,1);
  iVar7 = Imf_3_2::TiledRgbaOutputFile::numXTiles((int)&out);
  iVar8 = Imf_3_2::TiledRgbaOutputFile::numYTiles((int)&out);
  Imf_3_2::TiledRgbaOutputFile::writeTiles((int)&out,0,iVar7 + -1,0,iVar8 + -2);
  Imf_3_2::TiledRgbaOutputFile::~TiledRgbaOutputFile((TiledRgbaOutputFile *)&out);
  operator_delete__(pvVar9);
  _Var5 = csl._M_dataplus;
  _Var4 = icsl._M_dataplus;
  _Var3 = ct._M_dataplus;
  _Var2 = ict._M_dataplus;
  iVar7 = Imf_3_2::globalThreadCount();
  Imf_3_2::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&out,_Var5._M_p,iVar7);
  cVar6 = Imf_3_2::RgbaInputFile::isComplete();
  if (cVar6 == '\0') {
    __assert_fail("in.isComplete ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testIsComplete.cpp"
                  ,0x53,
                  "void (anonymous namespace)::checkFiles(const char *, const char *, const char *, const char *)"
                 );
  }
  Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&out);
  iVar7 = Imf_3_2::globalThreadCount();
  Imf_3_2::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&out,_Var4._M_p,iVar7);
  cVar6 = Imf_3_2::RgbaInputFile::isComplete();
  if (cVar6 != '\0') {
    __assert_fail("!in.isComplete ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testIsComplete.cpp"
                  ,0x58,
                  "void (anonymous namespace)::checkFiles(const char *, const char *, const char *, const char *)"
                 );
  }
  Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&out);
  iVar7 = Imf_3_2::globalThreadCount();
  Imf_3_2::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&out,_Var3._M_p,iVar7);
  cVar6 = Imf_3_2::RgbaInputFile::isComplete();
  if (cVar6 == '\0') {
    __assert_fail("in.isComplete ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testIsComplete.cpp"
                  ,0x5d,
                  "void (anonymous namespace)::checkFiles(const char *, const char *, const char *, const char *)"
                 );
  }
  Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&out);
  iVar7 = Imf_3_2::globalThreadCount();
  Imf_3_2::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&out,_Var2._M_p,iVar7);
  cVar6 = Imf_3_2::RgbaInputFile::isComplete();
  if (cVar6 == '\0') {
    Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&out);
    iVar7 = Imf_3_2::globalThreadCount();
    Imf_3_2::TiledRgbaInputFile::TiledRgbaInputFile((TiledRgbaInputFile *)&out,_Var3._M_p,iVar7);
    cVar6 = Imf_3_2::TiledRgbaInputFile::isComplete();
    if (cVar6 == '\0') {
      __assert_fail("in.isComplete ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testIsComplete.cpp"
                    ,0x67,
                    "void (anonymous namespace)::checkFiles(const char *, const char *, const char *, const char *)"
                   );
    }
    Imf_3_2::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&out);
    iVar7 = Imf_3_2::globalThreadCount();
    Imf_3_2::TiledRgbaInputFile::TiledRgbaInputFile((TiledRgbaInputFile *)&out,_Var2._M_p,iVar7);
    cVar6 = Imf_3_2::TiledRgbaInputFile::isComplete();
    if (cVar6 == '\0') {
      Imf_3_2::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&out);
      remove(csl._M_dataplus._M_p);
      remove(icsl._M_dataplus._M_p);
      remove(ct._M_dataplus._M_p);
      remove(ict._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ok\n",3);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
      std::ostream::put('X');
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ict._M_dataplus._M_p != &ict.field_2) {
        operator_delete(ict._M_dataplus._M_p,ict.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ct._M_dataplus._M_p != &ct.field_2) {
        operator_delete(ct._M_dataplus._M_p,ct.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)icsl._M_dataplus._M_p != &icsl.field_2) {
        operator_delete(icsl._M_dataplus._M_p,icsl.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)csl._M_dataplus._M_p != &csl.field_2) {
        operator_delete(csl._M_dataplus._M_p,csl.field_2._M_allocated_capacity + 1);
      }
      return;
    }
    __assert_fail("!in.isComplete ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testIsComplete.cpp"
                  ,0x6c,
                  "void (anonymous namespace)::checkFiles(const char *, const char *, const char *, const char *)"
                 );
  }
  __assert_fail("!in.isComplete ()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testIsComplete.cpp"
                ,0x62,
                "void (anonymous namespace)::checkFiles(const char *, const char *, const char *, const char *)"
               );
}

Assistant:

void
testIsComplete (const std::string& tempDir)
{
    try
    {
        cout << "Testing isComplete() function" << endl;

        std::string csl  = tempDir + "imf_test_complete_sl.exr";
        std::string icsl = tempDir + "imf_test_incomplete_sl.exr";
        std::string ct   = tempDir + "imf_test_complete_t.exr";
        std::string ict  = tempDir + "imf_test_incomplete_t.exr";

        writeFiles (
            csl.c_str (),
            icsl.c_str (),
            ct.c_str (),
            ict.c_str (),
            327,
            289,
            17,
            17);
        checkFiles (csl.c_str (), icsl.c_str (), ct.c_str (), ict.c_str ());

        remove (csl.c_str ());
        remove (icsl.c_str ());
        remove (ct.c_str ());
        remove (ict.c_str ());

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}